

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerMSL::is_non_native_row_major_matrix(CompilerMSL *this,uint32_t id)

{
  Variant *pVVar1;
  bool bVar2;
  ulong uVar3;
  SPIRExpression *pSVar4;
  
  uVar3 = (ulong)id;
  if (uVar3 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
              super_VectorView<spirv_cross::Variant>.buffer_size) {
    pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>
             .ptr;
    if (pVVar1[uVar3].type == TypeExpression) {
      pSVar4 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + uVar3);
      return pSVar4->need_transpose;
    }
  }
  bVar2 = Compiler::has_decoration((Compiler *)this,(ID)id,DecorationRowMajor);
  return bVar2;
}

Assistant:

T *maybe_get(uint32_t id)
	{
		if (id >= ir.ids.size())
			return nullptr;
		else if (ir.ids[id].get_type() == static_cast<Types>(T::type))
			return &get<T>(id);
		else
			return nullptr;
	}